

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

long GetStreamReadAvailable(PaStream *s)

{
  PaAlsaStream *in_RDI;
  int xrun;
  unsigned_long avail;
  PaAlsaStream *stream;
  PaError result;
  int local_2c;
  long local_28;
  uint in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  PaAlsaStream *self;
  
  uVar1 = 0;
  self = in_RDI;
  paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                         ((PaAlsaStreamComponent *)in_RDI,
                          (unsigned_long *)(ulong)in_stack_ffffffffffffffe8,(int *)in_RDI);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4512\n"
                     );
  }
  else {
    if (local_2c == 0) {
      return local_28;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun(in_RDI);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaAlsaStream_HandleXrun( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4515\n"
                       );
    }
    else {
      paUtilErr_ = PaAlsaStreamComponent_GetAvailableFrames
                             ((PaAlsaStreamComponent *)self,
                              (unsigned_long *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                              (int *)in_RDI);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4516\n"
                         );
      }
      else {
        if (local_2c == 0) {
          return local_28;
        }
        paUtilErr_ = -0x26fd;
        PaUtil_DebugPrint(
                         "Expression \'paInputOverflowed\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4518\n"
                         );
      }
    }
  }
  return (long)paUtilErr_;
}

Assistant:

static signed long GetStreamReadAvailable( PaStream* s )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*)s;
    unsigned long avail;
    int xrun;

    PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun ) );
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( stream ) );
        PA_ENSURE( PaAlsaStreamComponent_GetAvailableFrames( &stream->capture, &avail, &xrun ) );
        if( xrun )
            PA_ENSURE( paInputOverflowed );
    }

    return (signed long)avail;

error:
    return result;
}